

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O0

void __thiscall Code_generator::visit(Code_generator *this,Inst_load_relative *s)

{
  uint uVar1;
  Expression *pEVar2;
  uint16_t uVar3;
  uint uVar4;
  undefined1 *puVar5;
  Relocation *reloc_00;
  allocator local_d1;
  string local_d0;
  Relocation *local_b0;
  Relocation *reloc;
  string local_a0 [4];
  int addend;
  string symbol;
  Value_type target_type;
  uint code;
  allocator local_39;
  string local_38;
  Inst_load_relative *local_18;
  Inst_load_relative *s_local;
  Code_generator *this_local;
  
  local_18 = s;
  s_local = (Inst_load_relative *)this;
  ast::Instruction::check_alignment((Instruction *)s);
  if ((local_18->ldst & 2) != 0) {
    puVar5 = &local_18->field_0x28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,
               "str instructions with PC relative address doesn\'t exist, only ldr exists",&local_39
              );
    error_report((Location *)puVar5,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  if (local_18->ldst == 1) {
    puVar5 = &local_18->field_0x28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&code,
               "ldrb instruction with PC relative address doesn\'t exist, only ldr exists",
               (allocator *)((long)&target_type + 3));
    error_report((Location *)puVar5,(string *)&code);
    std::__cxx11::string::~string((string *)&code);
    std::allocator<char>::~allocator((allocator<char> *)((long)&target_type + 3));
  }
  uVar1 = local_18->rd->n;
  uVar4 = (*local_18->target->_vptr_Expression[3])();
  if ((uVar4 & 1) != 0) {
    symbol.field_2._12_4_ = ast::Expression::get_type(local_18->target);
    if (symbol.field_2._12_4_ == LABEL) {
      (*local_18->target->_vptr_Expression[4])(local_a0);
      uVar3 = ast::Expression::get_value(local_18->target);
      reloc._4_4_ = uVar3 - 2;
      reloc_00 = (Relocation *)operator_new(0x50);
      reloc_00->location = (Location *)&local_18->field_0x28;
      reloc_00->exp_location = &local_18->target->location;
      reloc_00->section_index = *(uint *)&local_18->field_0x40;
      reloc_00->section_offset = *(uint *)&local_18->field_0x44;
      reloc_00->position = 4;
      reloc_00->width = 6;
      reloc_00->type = RELATIVE_UNSIGNED;
      std::__cxx11::string::string((string *)&reloc_00->symbol,local_a0);
      reloc_00->addend = reloc._4_4_;
      local_b0 = reloc_00;
      ast::Relocations::add(reloc_00);
      std::__cxx11::string::~string(local_a0);
    }
    else {
      pEVar2 = local_18->target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d0,"Invalid expression, must be a label",&local_d1);
      error_report(&pEVar2->location,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
  }
  ast::Sections::write16
            (*(uint *)&local_18->field_0x40,*(uint *)&local_18->field_0x44,(short)uVar1 + 0xc00);
  return;
}

Assistant:

void Code_generator::visit(Inst_load_relative *s)
{
	s->check_alignment();
	if ((s->ldst & 2) != 0) // is a STR
		error_report(&s->location, "str instructions with PC relative address doesn't exist, only ldr exists");
	if (s->ldst == 1)       // is a LDRB
		error_report(&s->location, "ldrb instruction with PC relative address doesn't exist, only ldr exists");
	unsigned code = LDR_RELATIVE_OPCODE + (s->rd->n << RD_POSITION);
	if (s->target->evaluate()) {
		auto target_type = s->target->get_type();
		if (target_type == Value_type::LABEL) {
			string symbol = s->target->get_symbol();
			auto addend = s->target->get_value() - 2;
			auto *reloc = new Relocation{&s->location, &s->target->location, s->section_index, s->section_offset,
							LDR_RELATIVE_CONSTANT_POSITION, LDR_RELATIVE_CONSTANT_SIZE,
							Relocation::Relocation_type::RELATIVE_UNSIGNED, symbol, addend};
			Relocations::add(reloc);
		}
		else
			error_report(&s->target->location, "Invalid expression, must be a label");
	}
	Sections::write16(s->section_index, s->section_offset, static_cast<uint16_t>(code));
}